

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

void __thiscall irr::gui::CGUITabControl::~CGUITabControl(CGUITabControl *this)

{
  long lVar1;
  
  lVar1 = *(long *)(*(long *)this + -0x18);
  ~CGUITabControl((CGUITabControl *)(&this->field_0x0 + lVar1),&VTT);
  operator_delete((CGUITabControl *)(&this->field_0x0 + lVar1),0x1a0);
  return;
}

Assistant:

CGUITabControl::~CGUITabControl()
{
	for (u32 i = 0; i < Tabs.size(); ++i) {
		if (Tabs[i])
			Tabs[i]->drop();
	}

	if (UpButton)
		UpButton->drop();

	if (DownButton)
		DownButton->drop();
}